

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O1

int dwarf_load_loclists(Dwarf_Debug dbg,Dwarf_Unsigned *loclists_count,Dwarf_Error *error)

{
  Dwarf_Chain pDVar1;
  bool bVar2;
  int iVar3;
  Dwarf_Loclists_Context buildhere;
  char *pcVar4;
  Dwarf_Loclists_Context *ppDVar5;
  Dwarf_Small *data;
  Dwarf_Unsigned DVar6;
  Dwarf_Chain space;
  Dwarf_Unsigned contextnum;
  Dwarf_Chain local_68;
  Dwarf_Unsigned nextoffset;
  char *local_58;
  Dwarf_Unsigned local_50;
  Dwarf_Small *local_48;
  Dwarf_Unsigned *local_40;
  Dwarf_Small *local_38;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_load_loclists()either null or it containsa stale Dwarf_Debug pointer"
                       );
    iVar3 = 1;
  }
  else if (dbg->de_loclists_context == (Dwarf_Loclists_Context *)0x0) {
    if ((dbg->de_debug_loclists).dss_size == 0) {
      iVar3 = -1;
    }
    else {
      local_40 = loclists_count;
      if (((dbg->de_debug_loclists).dss_data != (Dwarf_Small *)0x0) ||
         (iVar3 = _dwarf_load_section(dbg,&dbg->de_debug_loclists,error), iVar3 == 0)) {
        contextnum = 0;
        nextoffset = 0;
        data = (dbg->de_debug_loclists).dss_data;
        DVar6 = (dbg->de_debug_loclists).dss_size;
        local_68 = (Dwarf_Chain)0x0;
        local_48 = data;
        if (0 < (long)DVar6) {
          local_38 = data + DVar6;
          contextnum = 0;
          local_50 = 0;
          local_58 = (char *)&local_68;
          do {
            buildhere = (Dwarf_Loclists_Context)malloc(0x78);
            if (buildhere == (Dwarf_Loclists_Context)0x0) {
              free_loclists_chain(dbg,local_68);
              _dwarf_error_string(dbg,error,0x3e,
                                  "DW_DLE_ALLOC_FAIL: Allocation of Loclists_Context failed");
              bVar2 = false;
            }
            else {
              buildhere->lc_loclists_header = (Dwarf_Small *)0x0;
              buildhere->lc_startaddr = (Dwarf_Small *)0x0;
              buildhere->lc_first_loclist_offset = 0;
              buildhere->lc_past_last_loclist_offset = 0;
              buildhere->lc_offsets_off_in_sect = 0;
              buildhere->lc_offsets_array = (Dwarf_Small *)0x0;
              buildhere->lc_offset_entry_count = 0;
              buildhere->lc_offset_value_array = (Dwarf_Unsigned *)0x0;
              buildhere->lc_magic = 0;
              buildhere->lc_offset_size = '\0';
              buildhere->lc_extension_size = '\0';
              buildhere->lc_address_size = '\0';
              buildhere->lc_segment_selector_size = '\0';
              buildhere->lc_version = 0;
              *(undefined2 *)&buildhere->field_0x2e = 0;
              buildhere->lc_header_offset = 0;
              buildhere->lc_length = 0;
              buildhere->lc_dbg = (Dwarf_Debug)0x0;
              buildhere->lc_index = 0;
              buildhere->lc_endaddr = (Dwarf_Small *)0x0;
              iVar3 = _dwarf_internal_read_loclists_header
                                (dbg,1,contextnum,DVar6,data,local_38,local_50,buildhere,&nextoffset
                                 ,error);
              if (iVar3 != 1) {
                buildhere->lc_magic = 0xadab4;
                pcVar4 = _dwarf_get_alloc(dbg,'\x1f',1);
                if (pcVar4 != (char *)0x0) {
                  *(Dwarf_Loclists_Context *)pcVar4 = buildhere;
                  contextnum = contextnum + 1;
                  *(char **)local_58 = pcVar4;
                  local_58 = pcVar4 + 0x10;
                  bVar2 = true;
                  local_50 = nextoffset;
                  goto LAB_00175077;
                }
                _dwarf_error_string(dbg,error,0x3e,
                                    "DW_DLE_ALLOC_FAIL: allocating Loclists_Context chain entry");
              }
              free_loclists_chain(dbg,local_68);
              free(buildhere->lc_offset_value_array);
              bVar2 = false;
              buildhere->lc_offset_value_array = (Dwarf_Unsigned *)0x0;
              buildhere->lc_magic = 0;
              free(buildhere);
            }
LAB_00175077:
            if (!bVar2) {
              bVar2 = true;
              contextnum = 0;
              ppDVar5 = (Dwarf_Loclists_Context *)0x0;
              goto LAB_0017513c;
            }
            data = local_48 + nextoffset;
          } while ((long)nextoffset < (long)DVar6);
        }
        ppDVar5 = (Dwarf_Loclists_Context *)malloc(contextnum * 8);
        if (ppDVar5 == (Dwarf_Loclists_Context *)0x0) {
          free_loclists_chain(dbg,local_68);
          _dwarf_error_string(dbg,error,0x3e,"Allocation of Loclists_Context pointer array failed");
          bVar2 = true;
          ppDVar5 = (Dwarf_Loclists_Context *)0x0;
          contextnum = 0;
        }
        else {
          if (contextnum != 0) {
            DVar6 = 0;
            space = local_68;
            do {
              ppDVar5[DVar6] = (Dwarf_Loclists_Context)space->ch_item;
              space->ch_item = (void *)0x0;
              pDVar1 = space->ch_next;
              dwarf_dealloc(dbg,space,0x1f);
              DVar6 = DVar6 + 1;
              space = pDVar1;
            } while (contextnum != DVar6);
          }
          bVar2 = false;
        }
LAB_0017513c:
        iVar3 = 1;
        if (!bVar2) {
          dbg->de_loclists_context = ppDVar5;
          dbg->de_loclists_context_count = contextnum;
          iVar3 = 0;
          if (local_40 != (Dwarf_Unsigned *)0x0) {
            *local_40 = contextnum;
          }
        }
      }
    }
  }
  else {
    iVar3 = 0;
    if (loclists_count != (Dwarf_Unsigned *)0x0) {
      *loclists_count = dbg->de_loclists_context_count;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
dwarf_load_loclists(Dwarf_Debug dbg,
    Dwarf_Unsigned *loclists_count,
    Dwarf_Error *error)
{
    int res = DW_DLV_ERROR;
    Dwarf_Loclists_Context *cxt = 0;
    Dwarf_Unsigned count = 0;

    CHECK_DBG(dbg,error,"dwarf_load_loclists()");
    if (dbg->de_loclists_context) {
        if (loclists_count) {
            *loclists_count = dbg->de_loclists_context_count;
        }
        return DW_DLV_OK;
    }
    if (!dbg->de_debug_loclists.dss_size) {
        /* nothing there. */
        return DW_DLV_NO_ENTRY;
    }
    if (!dbg->de_debug_loclists.dss_data) {
        res = _dwarf_load_section(dbg, &dbg->de_debug_loclists,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    /*  cxt is set to a pointer to a context, which is
        actually an array of pointers to such contexts, 'count'
        of them. Each context has the loclists offset table
        (if it has at least on entry in the table)
        pointed in each cxt. */
    res = internal_load_loclists_contexts(dbg,&cxt,&count,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    dbg->de_loclists_context = cxt;
    dbg->de_loclists_context_count = count;
    if (loclists_count) {
        *loclists_count = count;
    }
    return DW_DLV_OK;
}